

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O0

void device_cleanup(void)

{
  embree::TutorialData_Destructor((TutorialData *)0x13fe7d);
  return;
}

Assistant:

void device_cleanup ()
{
  TutorialData_Destructor(&data);
}